

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cc
# Opt level: O0

void __thiscall flow::Value::~Value(Value *this)

{
  FILE *__stream;
  bool bVar1;
  undefined8 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  string_view format_str;
  allocator<char> local_81;
  string local_80;
  string local_60;
  basic_string_view<char> local_40;
  string local_30;
  Value *local_10;
  Value *this_local;
  
  this->_vptr_Value = (_func_int **)&PTR__Value_002cb500;
  local_10 = this;
  bVar1 = isUsed(this);
  __stream = _stderr;
  if (!bVar1) {
    std::vector<flow::Instr_*,_std::allocator<flow::Instr_*>_>::~vector(&this->uses_);
    std::__cxx11::string::~string((string *)&this->name_);
    return;
  }
  fmt::v5::basic_string_view<char>::basic_string_view
            (&local_40,"Value being destroyed is still in use by: {}.");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,", ",&local_81);
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  join<std::vector<flow::Instr*,std::allocator<flow::Instr*>>>
            (&local_60,&this->uses_,&local_80,0x189240);
  format_str.size_ = (size_t)&local_60;
  format_str.data_ = (char *)local_40.size_;
  fmt::v5::format<std::__cxx11::string>(&local_30,(v5 *)local_40.data_,format_str,args);
  uVar2 = std::__cxx11::string::c_str();
  fprintf(__stream,"%s\n",uVar2);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  abort();
}

Assistant:

Value::~Value() {
  FLOW_ASSERT(!isUsed(), fmt::format(
              "Value being destroyed is still in use by: {}.",
              join(uses_, ", ", &Instr::name)));
}